

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall
Fl_Preferences::RootNode::RootNode
          (RootNode *this,Fl_Preferences *prefs,char *path,char *vendor,char *application)

{
  char *pcVar1;
  char *pcVar2;
  void *__buf;
  int __fd;
  char local_838 [8];
  char filename [2048];
  char *local_30;
  char *application_local;
  char *vendor_local;
  char *path_local;
  Fl_Preferences *prefs_local;
  RootNode *this_local;
  
  this->prefs_ = prefs;
  this->filename_ = (char *)0x0;
  this->vendor_ = (char *)0x0;
  this->application_ = (char *)0x0;
  application_local = vendor;
  if (vendor == (char *)0x0) {
    application_local = "unknown";
  }
  if (application == (char *)0x0) {
    local_30 = "unknown";
    pcVar1 = strdup(path);
    __fd = (int)prefs;
    this->filename_ = pcVar1;
  }
  else {
    local_838[0] = '\0';
    __fd = 0x800;
    snprintf(local_838,0x800,"%s/%s.prefs",path,application);
    pcVar1 = strdup(local_838);
    this->filename_ = pcVar1;
    local_30 = application;
  }
  pcVar1 = strdup(application_local);
  this->vendor_ = pcVar1;
  pcVar2 = strdup(local_30);
  this->application_ = pcVar2;
  read(this,__fd,__buf,(size_t)pcVar1);
  return;
}

Assistant:

Fl_Preferences::RootNode::RootNode( Fl_Preferences *prefs, const char *path, const char *vendor, const char *application )
: prefs_(prefs),
  filename_(0L),
  vendor_(0L),
  application_(0L) {

  if (!vendor)
    vendor = "unknown";
  if (!application) {
    application = "unknown";
    filename_ = strdup(path);
  } else {
    char filename[ FL_PATH_MAX ]; filename[0] = 0;
    snprintf(filename, sizeof(filename), "%s/%s.prefs", path, application);
    filename_  = strdup(filename);
  }
  vendor_      = strdup(vendor);
  application_ = strdup(application); 
  read();
}